

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lazy.h
# Opt level: O2

void __thiscall
async_simple::coro::detail::LazyPromise<cinatra::read_result>::unhandled_exception
          (LazyPromise<cinatra::read_result> *this)

{
  exception_ptr eStack_18;
  
  std::current_exception();
  std::variant<std::monostate,cinatra::read_result,std::__exception_ptr::exception_ptr>::
  emplace<2ul,std::__exception_ptr::exception_ptr>
            ((variant<std::monostate,cinatra::read_result,std::__exception_ptr::exception_ptr> *)
             &this->_value,&eStack_18);
  std::__exception_ptr::exception_ptr::~exception_ptr(&eStack_18);
  return;
}

Assistant:

void unhandled_exception() noexcept {
        _value.template emplace<std::exception_ptr>(std::current_exception());
    }